

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O2

Type * __thiscall
slang::ast::Type::fromLookupResult
          (Type *this,Compilation *compilation,LookupResult *result,SourceRange sourceRange,
          ASTContext *context)

{
  ElementSelectSyntax *syntax;
  bool bVar1;
  variant_alternative_t<0UL,_variant<const_ElementSelectSyntax_*,_MemberSelector>_> *ppEVar2;
  Type *pTVar3;
  Diagnostic *this_00;
  long lVar4;
  SourceLocation context_00;
  long lVar5;
  SourceRange sourceRange_00;
  EvaluatedDimension dim;
  EvaluatedDimension local_50;
  
  context_00 = sourceRange.endLoc;
  sourceRange_00.endLoc = sourceRange.startLoc;
  pTVar3 = (Type *)(compilation->super_BumpAllocator).head;
  if (pTVar3 != (Type *)0x0) {
    bVar1 = Symbol::isType((Symbol *)pTVar3);
    if (bVar1) {
      lVar4 = *(long *)&(compilation->options).maxConstexprDepth;
      lVar5 = lVar4 * 0x30;
      while( true ) {
        lVar5 = lVar5 + -0x30;
        bVar1 = lVar4 == 0;
        lVar4 = lVar4 + -1;
        if (bVar1) break;
        ppEVar2 = std::
                  get<0ul,slang::syntax::ElementSelectSyntax_const*,slang::ast::LookupResult::MemberSelector>
                            ((variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                              *)(*(long *)&(compilation->options).maxCheckerInstanceDepth + lVar5));
        syntax = *ppEVar2;
        ASTContext::evalPackedDimension(&local_50,(ASTContext *)context_00,syntax);
        pTVar3 = PackedArrayType::fromSyntax
                           (*(Scope **)context_00,pTVar3,&local_50,&syntax->super_SyntaxNode);
      }
      return pTVar3;
    }
    if (((pTVar3->super_Symbol).kind == NetType) && ((*(byte *)((long)context_00 + 0x13) & 8) != 0))
    {
      LookupResult::errorIfSelectors((LookupResult *)compilation,(ASTContext *)context_00);
      pTVar3 = DeclaredType::getType((DeclaredType *)&pTVar3->canonical);
      return pTVar3;
    }
    sourceRange_00.startLoc = (SourceLocation)result;
    this_00 = ASTContext::addDiag((ASTContext *)context_00,(DiagCode)0x24000a,sourceRange_00);
    Diagnostic::operator<<(this_00,(pTVar3->super_Symbol).name);
  }
  return (Type *)this[5].super_Symbol.nextInScope;
}

Assistant:

const Type& Type::fromLookupResult(Compilation& compilation, const LookupResult& result,
                                   SourceRange sourceRange, const ASTContext& context) {
    const Symbol* symbol = result.found;
    if (!symbol)
        return compilation.getErrorType();

    if (!symbol->isType()) {
        if (symbol->kind == SymbolKind::NetType && context.flags.has(ASTFlags::AllowNetType)) {
            result.errorIfSelectors(context);
            return symbol->as<NetType>().getDataType();
        }

        context.addDiag(diag::NotAType, sourceRange) << symbol->name;
        return compilation.getErrorType();
    }

    const Type* finalType = &symbol->as<Type>();
    size_t count = result.selectors.size();
    for (size_t i = 0; i < count; i++) {
        // It's not possible to have dotted selectors here because the Lookup
        // operation will error if we try to dot into a type, and will only
        // return selectors if the symbol is value-like, in which case we will
        // fail the isType() check above.
        auto selectSyntax = std::get<const ElementSelectSyntax*>(result.selectors[count - i - 1]);
        auto dim = context.evalPackedDimension(*selectSyntax);
        finalType = &PackedArrayType::fromSyntax(*context.scope, *finalType, dim, *selectSyntax);
    }

    return *finalType;
}